

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall StringOutput::rawprint(StringOutput *this,char *data,size_t size)

{
  char *__beg;
  mutex_type *in_RDI;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> *in_stack_ffffffffffffffa0;
  unique_lock<std::mutex> *this_00;
  char *in_stack_ffffffffffffffc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  const_iterator in_stack_ffffffffffffffd8;
  
  std::unique_lock<std::mutex>::unique_lock(in_stack_ffffffffffffffa0,in_RDI);
  this_00 = *(unique_lock<std::mutex> **)((long)&(in_RDI->super___mutex_base)._M_mutex + 8);
  __beg = (char *)std::__cxx11::string::end();
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this_00,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_RDI);
  std::__cxx11::string::insert<char_const*,void>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffd8,__beg,in_stack_ffffffffffffffc0);
  std::unique_lock<std::mutex>::~unique_lock(this_00);
  return;
}

Assistant:

virtual void rawprint(const char* data, size_t size)
	{
		std::unique_lock<std::mutex> lock(mutex);

		result.insert(result.end(), data, data + size);
	}